

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmcursor.cpp
# Opt level: O0

void __thiscall QEglFSKmsGbmCursor::initCursorAtlas(QEglFSKmsGbmCursor *this)

{
  QEglFSKmsScreen *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  ulong uVar5;
  QPlatformScreen **ppQVar6;
  QKmsDevice *pQVar7;
  QKmsOutput *pQVar8;
  long lVar9;
  qsizetype qVar10;
  long in_RDI;
  long in_FS_OFFSET;
  double dVar11;
  undefined1 auVar12 [16];
  QLatin1String QVar13;
  QLatin1String QVar14;
  QLatin1String QVar15;
  int i;
  int cursorsPerRow;
  QEglFSKmsScreen *kmsScreen;
  QPlatformScreen *screen;
  QList<QPlatformScreen_*> *__range2;
  QImage image;
  QPoint hotSpot;
  QJsonArray hotSpots;
  QString atlas;
  QJsonObject object;
  QJsonDocument doc;
  iterator __end2;
  iterator __begin2;
  QFile file;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  int in_stack_fffffffffffffd98;
  OpenModeFlag in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  int in_stack_fffffffffffffda4;
  QByteArray *in_stack_fffffffffffffda8;
  Format f;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  QFlagsStorage<Qt::ImageConversionFlag> flags;
  undefined1 in_stack_fffffffffffffde0 [16];
  QImage local_1c8 [24];
  undefined8 local_1b0;
  undefined8 local_1a8;
  undefined8 local_1a0;
  QJsonArray local_198 [8];
  undefined1 local_190 [16];
  QJsonArray local_180 [8];
  undefined1 local_178 [16];
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  QJsonParseError local_138 [24];
  undefined8 local_120;
  QPlatformScreen **local_118;
  iterator local_110;
  iterator local_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [24];
  undefined8 local_c8;
  undefined8 local_c0;
  QDebug local_98;
  QJsonValue local_90 [24];
  QJsonValue local_78 [24];
  QJsonValue local_60 [24];
  QJsonValue local_48 [24];
  QJsonValue local_30 [24];
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((initCursorAtlas()::json == '\0') &&
     (iVar2 = __cxa_guard_acquire(&initCursorAtlas()::json), iVar2 != 0)) {
    qgetenv((char *)&initCursorAtlas::json);
    __cxa_atexit(QByteArray::~QByteArray,&initCursorAtlas::json,&__dso_handle);
    __cxa_guard_release(&initCursorAtlas()::json);
  }
  bVar1 = QByteArray::isEmpty((QByteArray *)0x111500);
  if (bVar1) {
    QByteArray::operator=(&initCursorAtlas::json,":/cursor.json");
  }
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::qLcEglfsKmsDebug();
  anon_unknown.dwarf_332a6::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_332a6::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x11156c);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
               (char *)in_stack_fffffffffffffda8,in_stack_fffffffffffffda4,
               (char *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
               (char *)0x111585);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                       in_stack_fffffffffffffde0._8_8_);
    QDebug::operator<<((QDebug *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                       in_stack_fffffffffffffda8);
    QDebug::~QDebug(&local_98);
    local_10 = 0;
  }
  local_c8 = 0xaaaaaaaaaaaaaaaa;
  local_c0 = 0xaaaaaaaaaaaaaaaa;
  QString::fromUtf8<void>
            ((QByteArray *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  QFile::QFile((QFile *)&local_c8,(QString *)local_e0);
  QString::~QString((QString *)0x11162b);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),in_stack_fffffffffffffd9c
            );
  uVar5 = QFile::open((QFlags_conflict *)&local_c8);
  if ((uVar5 & 1) == 0) {
    (**(code **)(**(long **)(in_RDI + 0x10) + 0x88))(local_100);
    local_108.i = (QPlatformScreen **)0xaaaaaaaaaaaaaaaa;
    local_108 = QList<QPlatformScreen_*>::begin
                          ((QList<QPlatformScreen_*> *)
                           CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    local_110.i = (QPlatformScreen **)0xaaaaaaaaaaaaaaaa;
    local_110 = QList<QPlatformScreen_*>::end
                          ((QList<QPlatformScreen_*> *)
                           CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    while( true ) {
      local_118 = local_110.i;
      bVar1 = QList<QPlatformScreen_*>::iterator::operator!=(&local_108,local_110);
      if (!bVar1) break;
      ppQVar6 = QList<QPlatformScreen_*>::iterator::operator*(&local_108);
      this_00 = (QEglFSKmsScreen *)*ppQVar6;
      pQVar7 = (QKmsDevice *)QEglFSKmsScreen::device(this_00);
      iVar2 = QKmsDevice::fd(pQVar7);
      pQVar8 = QEglFSKmsScreen::output(this_00);
      drmModeSetCursor(iVar2,pQVar8->crtc_id,0,0);
      pQVar7 = (QKmsDevice *)QEglFSKmsScreen::device(this_00);
      iVar2 = QKmsDevice::fd(pQVar7);
      pQVar8 = QEglFSKmsScreen::output(this_00);
      drmModeMoveCursor(iVar2,pQVar8->crtc_id,0);
      QList<QPlatformScreen_*>::iterator::operator++(&local_108);
    }
    QList<QPlatformScreen_*>::~QList((QList<QPlatformScreen_*> *)0x111713);
    *(undefined4 *)(in_RDI + 0x50) = 0;
  }
  else {
    local_120 = 0xaaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    QJsonDocument::fromJson((QByteArray *)&local_120,local_138);
    QByteArray::~QByteArray((QByteArray *)0x111817);
    local_140 = 0xaaaaaaaaaaaaaaaa;
    QJsonDocument::object();
    local_158 = 0xaaaaaaaaaaaaaaaa;
    local_150 = 0xaaaaaaaaaaaaaaaa;
    local_148 = 0xaaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffda8,
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    QVar13.m_data = (char *)&local_140;
    QVar13.m_size = (qsizetype)local_30;
    QJsonObject::value(QVar13);
    QJsonValue::toString();
    QJsonValue::~QJsonValue(local_30);
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffda8,
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    QVar14.m_data = (char *)&local_140;
    QVar14.m_size = (qsizetype)local_48;
    QJsonObject::value(QVar14);
    dVar11 = (double)QJsonValue::toDouble(0.0);
    iVar3 = (int)dVar11;
    QJsonValue::~QJsonValue(local_48);
    *(int *)(in_RDI + 0x60) = iVar3;
    local_160 = 0xaaaaaaaaaaaaaaaa;
    iVar2 = iVar3;
    Qt::Literals::StringLiterals::operator____L1
              ((char *)in_stack_fffffffffffffda8,
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    QVar15.m_data = (char *)&local_140;
    QVar15.m_size = (qsizetype)local_60;
    QJsonObject::value(QVar15);
    QJsonValue::toArray();
    QJsonValue::~QJsonValue(local_60);
    flags.i = 0;
    while( true ) {
      lVar9 = (long)(int)flags.i;
      qVar10 = QJsonArray::count((QJsonArray *)0x1119c1);
      if (qVar10 <= lVar9) break;
      local_168 = 0xaaaaaaaaaaaaaaaa;
      QJsonArray::operator[]((longlong)local_78);
      QJsonValue::toArray();
      auVar12 = QJsonArray::operator[]((longlong)local_180);
      local_178 = auVar12;
      dVar11 = QJsonValueRef::toDouble
                         ((QJsonValueRef *)
                          CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                          (double)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      in_stack_fffffffffffffda4 = (int)dVar11;
      QJsonArray::operator[]((longlong)local_90);
      QJsonValue::toArray();
      auVar12 = QJsonArray::operator[]((longlong)local_198);
      local_190 = auVar12;
      QJsonValueRef::toDouble
                ((QJsonValueRef *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (double)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98);
      QJsonArray::~QJsonArray(local_198);
      QJsonValue::~QJsonValue(local_90);
      QJsonArray::~QJsonArray(local_180);
      QJsonValue::~QJsonValue(local_78);
      QList<QPoint>::operator<<
                ((QList<QPoint> *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (parameter_type)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      flags.i = flags.i + 1;
    }
    local_1b0 = 0xaaaaaaaaaaaaaaaa;
    local_1a8 = 0xaaaaaaaaaaaaaaaa;
    local_1a0 = 0xaaaaaaaaaaaaaaaa;
    QImage::QImage(local_1c8,(QString *)&local_158,(char *)0x0);
    f = (Format)((ulong)lVar9 >> 0x20);
    QFlags<Qt::ImageConversionFlag>::QFlags
              ((QFlags<Qt::ImageConversionFlag> *)
               CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
               in_stack_fffffffffffffd9c);
    QImage::convertToFormat
              ((QImage *)CONCAT44(iVar2,in_stack_fffffffffffffdb0),f,(ImageConversionFlags)flags.i);
    QImage::~QImage(local_1c8);
    iVar2 = QImage::width();
    *(int *)(in_RDI + 0x6c) = iVar2 / *(int *)(in_RDI + 0x60);
    iVar2 = QImage::height();
    *(int *)(in_RDI + 0x70) = iVar2 / ((iVar3 + 0x15) / iVar3);
    uVar4 = QImage::width();
    *(undefined4 *)(in_RDI + 100) = uVar4;
    uVar4 = QImage::height();
    *(undefined4 *)(in_RDI + 0x68) = uVar4;
    QImage::operator=((QImage *)(in_RDI + 0x90),(QImage *)&local_1b0);
    QImage::~QImage((QImage *)&local_1b0);
    QJsonArray::~QJsonArray((QJsonArray *)&local_160);
    QString::~QString((QString *)0x111c58);
    QJsonObject::~QJsonObject((QJsonObject *)&local_140);
    QJsonDocument::~QJsonDocument((QJsonDocument *)&local_120);
  }
  QFile::~QFile((QFile *)&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QEglFSKmsGbmCursor::initCursorAtlas()
{
    static QByteArray json = qgetenv("QT_QPA_EGLFS_CURSOR");
    if (json.isEmpty())
        json = ":/cursor.json";

    qCDebug(qLcEglfsKmsDebug) << "Initializing cursor atlas from" << json;

    QFile file(QString::fromUtf8(json));
    if (!file.open(QFile::ReadOnly)) {
        for (QPlatformScreen *screen : m_screen->virtualSiblings()) {
            QEglFSKmsScreen *kmsScreen = static_cast<QEglFSKmsScreen *>(screen);
            drmModeSetCursor(kmsScreen->device()->fd(), kmsScreen->output().crtc_id, 0, 0, 0);
            drmModeMoveCursor(kmsScreen->device()->fd(), kmsScreen->output().crtc_id, 0, 0);
        }
        m_state = CursorDisabled;
        return;
    }

    QJsonDocument doc = QJsonDocument::fromJson(file.readAll());
    QJsonObject object = doc.object();

    QString atlas = object.value("image"_L1).toString();
    Q_ASSERT(!atlas.isEmpty());

    const int cursorsPerRow = object.value("cursorsPerRow"_L1).toDouble();
    Q_ASSERT(cursorsPerRow);
    m_cursorAtlas.cursorsPerRow = cursorsPerRow;

    const QJsonArray hotSpots = object.value("hotSpots"_L1).toArray();
    Q_ASSERT(hotSpots.count() == Qt::LastCursor + 1);
    for (int i = 0; i < hotSpots.count(); i++) {
        QPoint hotSpot(hotSpots[i].toArray()[0].toDouble(), hotSpots[i].toArray()[1].toDouble());
        m_cursorAtlas.hotSpots << hotSpot;
    }

    QImage image = QImage(atlas).convertToFormat(QImage::Format_ARGB32);
    m_cursorAtlas.cursorWidth = image.width() / m_cursorAtlas.cursorsPerRow;
    m_cursorAtlas.cursorHeight = image.height() / ((Qt::LastCursor + cursorsPerRow) / cursorsPerRow);
    m_cursorAtlas.width = image.width();
    m_cursorAtlas.height = image.height();
    m_cursorAtlas.image = image;
}